

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

size_t uv__thread_stack_size(void)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  rlimit lim;
  rlimit64 local_20;
  
  iVar1 = getrlimit64(RLIMIT_STACK,&local_20);
  sVar3 = 0x200000;
  if (local_20.rlim_cur != 0xffffffffffffffff && iVar1 == 0) {
    iVar1 = getpagesize();
    uVar4 = local_20.rlim_cur - local_20.rlim_cur % (ulong)(long)iVar1;
    if (0x1fff < uVar4) {
      local_20.rlim_cur = uVar4;
      uVar2 = __sysconf(0x4b);
      sVar3 = 0x200000;
      if (uVar2 <= uVar4) {
        sVar3 = local_20.rlim_cur;
      }
    }
  }
  return sVar3;
}

Assistant:

size_t uv__thread_stack_size(void) {
#if defined(__APPLE__) || defined(__linux__)
  struct rlimit lim;

  /* getrlimit() can fail on some aarch64 systems due to a glibc bug where
   * the system call wrapper invokes the wrong system call. Don't treat
   * that as fatal, just use the default stack size instead.
   */
  if (0 == getrlimit(RLIMIT_STACK, &lim) && lim.rlim_cur != RLIM_INFINITY) {
    /* pthread_attr_setstacksize() expects page-aligned values. */
    lim.rlim_cur -= lim.rlim_cur % (rlim_t) getpagesize();

    /* Musl's PTHREAD_STACK_MIN is 2 KB on all architectures, which is
     * too small to safely receive signals on.
     *
     * Musl's PTHREAD_STACK_MIN + MINSIGSTKSZ == 8192 on arm64 (which has
     * the largest MINSIGSTKSZ of the architectures that musl supports) so
     * let's use that as a lower bound.
     *
     * We use a hardcoded value because PTHREAD_STACK_MIN + MINSIGSTKSZ
     * is between 28 and 133 KB when compiling against glibc, depending
     * on the architecture.
     */
    if (lim.rlim_cur >= 8192)
      if (lim.rlim_cur >= PTHREAD_STACK_MIN)
        return lim.rlim_cur;
  }
#endif

#if !defined(__linux__)
  return 0;
#elif defined(__PPC__) || defined(__ppc__) || defined(__powerpc__)
  return 4 << 20;  /* glibc default. */
#else
  return 2 << 20;  /* glibc default. */
#endif
}